

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

str_attr_accessor * __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::attr
          (str_attr_accessor *__return_storage_ptr__,
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
          *this,char *key)

{
  PyObject *local_20;
  
  accessor::operator_cast_to_object((accessor *)&local_20);
  (__return_storage_ptr__->obj).m_ptr = local_20;
  __return_storage_ptr__->key = key;
  (__return_storage_ptr__->cache).super_handle.m_ptr = (PyObject *)0x0;
  object::~object((object *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

str_attr_accessor object_api<D>::attr(const char *key) const {
    return {derived(), key};
}